

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O3

bool GCPtr<symbols::Object>::collect(void)

{
  bool bVar1;
  list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *plVar2;
  
  bVar1 = false;
  do {
    plVar2 = &gclist_abi_cxx11_;
    do {
      plVar2 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
               (plVar2->
               super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>)
               ._M_impl._M_node.super__List_node_base._M_next;
      if (plVar2 == &gclist_abi_cxx11_) {
        return bVar1;
      }
    } while (*(int *)((long)plVar2 + 0x10) != 0);
    std::__cxx11::list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>::remove
              (&gclist_abi_cxx11_,(char *)((long)plVar2 + 0x10));
    bVar1 = true;
    if (*(_List_node_base **)((long)plVar2 + 0x10U + 8) != (_List_node_base *)0x0) {
      (**(code **)((long)(*(_List_node_base **)((long)plVar2 + 0x10U + 8))->_M_next + 0x10))();
    }
  } while( true );
}

Assistant:

bool GCPtr<T>::collect() {
    bool memfreed = false;
    #ifdef DISPLAY
        cout << "Before garbage collection for ";
        showlist();
    #endif

    typename list<GCInfo<T>>::iterator p;

    do{
        // Scan gclist looking for unreferenced pointers.
        for(p = gclist.begin(); p != gclist.end(); p++){
            // If in-use, skip.
            if(p->refcount > 0) continue;
            memfreed = true;
            // Remove unused entry from gclist.
            gclist.remove(*p);
            // Free memory unless the GCPtr is null
            if(p->memPtr){

                #ifdef DISPLAY
                cout << "Deleting: " << p->memPtr << "\n";
                #endif
                delete  p->memPtr; // delete single element
            }
            // Restart the search
            break;
        }
    }while( p != gclist.end());
    #ifdef DISPLAY
    cout << "After garbage collection for ";
    showlist();
    #endif
    return memfreed;
}